

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_input.cpp
# Opt level: O0

Omega_h * __thiscall Omega_h::get_full_name_abi_cxx11_(Omega_h *this,Input *input)

{
  bool bVar1;
  InputList *this_00;
  InputMap *this_01;
  string *psVar2;
  string *name;
  int local_58;
  LO i;
  Omega_h local_48 [32];
  Input *local_28;
  Input *parent;
  Input *local_18;
  Input *input_local;
  string *full_name;
  
  parent._7_1_ = 0;
  local_18 = input;
  input_local = (Input *)this;
  std::__cxx11::string::string((string *)this);
  if (local_18->parent != (Input *)0x0) {
    local_28 = local_18->parent;
    get_full_name_abi_cxx11_(local_48,local_28);
    std::__cxx11::string::operator=((string *)this,(string *)local_48);
    std::__cxx11::string::~string((string *)local_48);
    bVar1 = is_type<Omega_h::InputList>(local_28);
    if (bVar1) {
      this_00 = as_type<Omega_h::InputList>(local_28);
      local_58 = InputList::position(this_00,local_18);
      std::__cxx11::string::operator+=((string *)this,"[");
      std::__cxx11::to_string((__cxx11 *)&name,local_58);
      std::__cxx11::string::operator+=((string *)this,(string *)&name);
      std::__cxx11::string::~string((string *)&name);
      std::__cxx11::string::operator+=((string *)this,"]");
    }
    else {
      bVar1 = is_type<Omega_h::InputMap>(local_28);
      if (bVar1) {
        this_01 = as_type<Omega_h::InputMap>(local_28);
        psVar2 = InputMap::name_abi_cxx11_(this_01,local_18);
        std::__cxx11::string::operator+=((string *)this,".");
        std::__cxx11::string::operator+=((string *)this,(string *)psVar2);
      }
    }
  }
  return this;
}

Assistant:

std::string get_full_name(Input const& input) {
  std::string full_name;
  if (input.parent != nullptr) {
    auto& parent = *(input.parent);
    full_name = get_full_name(parent);
    if (is_type<InputList>(parent)) {
      auto i = as_type<InputList>(parent).position(input);
      full_name += "[";
      full_name += std::to_string(i);
      full_name += "]";
    } else if (is_type<InputMap>(parent)) {
      auto& name = as_type<InputMap>(parent).name(input);
      full_name += ".";
      full_name += name;
    }
  }
  return full_name;
}